

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

void expr_discharge(FuncState *fs,ExpDesc *e)

{
  uint uVar1;
  BCReg BVar2;
  BCPos BVar3;
  ExpKind EVar4;
  BCIns ins;
  
  switch(e->k) {
  case VLOCAL:
    EVar4 = VNONRELOC;
    goto LAB_0011c08a;
  case VUPVAL:
    ins = (e->u).s.info << 0x10 | 0x2b;
    break;
  case VGLOBAL:
    BVar2 = const_gc(fs,(GCobj *)(e->u).sval,0xfffffffb);
    ins = BVar2 << 0x10 | 0x34;
    break;
  case VINDEXED:
    uVar1 = (e->u).s.aux;
    if ((int)uVar1 < 0) {
      ins = ~uVar1 << 0x10 | (e->u).s.info << 0x18 | 0x37;
    }
    else if (uVar1 < 0x100) {
      if (fs->nactvar <= uVar1) {
        fs->freereg = fs->freereg - 1;
      }
      ins = uVar1 * 0x10000 + (e->u).s.info * 0x1000000 + 0x36;
    }
    else {
      ins = uVar1 * 0x10000 - 0xffffc8 | (e->u).s.info << 0x18;
    }
    if (fs->nactvar <= (e->u).s.info) {
      fs->freereg = fs->freereg - 1;
    }
    break;
  default:
    goto switchD_0011bfec_caseD_a;
  case VCALL:
    BVar3 = (e->u).s.aux;
    EVar4 = VNONRELOC;
    goto LAB_0011c088;
  }
  BVar3 = bcemit_INS(fs,ins);
  EVar4 = VRELOCABLE;
LAB_0011c088:
  (e->u).s.info = BVar3;
LAB_0011c08a:
  e->k = EVar4;
switchD_0011bfec_caseD_a:
  return;
}

Assistant:

static void expr_discharge(FuncState *fs, ExpDesc *e)
{
  BCIns ins;
  if (e->k == VUPVAL) {
    ins = BCINS_AD(BC_UGET, 0, e->u.s.info);
  } else if (e->k == VGLOBAL) {
    ins = BCINS_AD(BC_GGET, 0, const_str(fs, e));
  } else if (e->k == VINDEXED) {
    BCReg rc = e->u.s.aux;
    if ((int32_t)rc < 0) {
      ins = BCINS_ABC(BC_TGETS, 0, e->u.s.info, ~rc);
    } else if (rc > BCMAX_C) {
      ins = BCINS_ABC(BC_TGETB, 0, e->u.s.info, rc-(BCMAX_C+1));
    } else {
      bcreg_free(fs, rc);
      ins = BCINS_ABC(BC_TGETV, 0, e->u.s.info, rc);
    }
    bcreg_free(fs, e->u.s.info);
  } else if (e->k == VCALL) {
    e->u.s.info = e->u.s.aux;
    e->k = VNONRELOC;
    return;
  } else if (e->k == VLOCAL) {
    e->k = VNONRELOC;
    return;
  } else {
    return;
  }
  e->u.s.info = bcemit_INS(fs, ins);
  e->k = VRELOCABLE;
}